

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O1

SystemSubroutine * __thiscall
slang::ast::Compilation::getSystemSubroutine(Compilation *this,string_view name)

{
  group_type_pointer pgVar1;
  group_type_pointer pgVar2;
  value_type_pointer ppVar3;
  ulong uVar4;
  uchar uVar5;
  uchar uVar6;
  uchar uVar7;
  uchar uVar8;
  size_t __n;
  char *__s1;
  int iVar9;
  uint64_t uVar10;
  SystemSubroutine *pSVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  basic_string_view<char,_std::char_traits<char>_> *pbVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  local_40._M_str = name._M_str;
  local_40._M_len = name._M_len;
  uVar10 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                     ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                      &this->subroutineNameMap,&local_40);
  __s1 = local_40._M_str;
  __n = local_40._M_len;
  uVar13 = uVar10 >> ((byte)(this->subroutineNameMap).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
                            .arrays.groups_size_index & 0x3f);
  pgVar2 = (this->subroutineNameMap).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
           .arrays.groups_;
  lVar14 = (uVar10 & 0xff) * 4;
  uVar5 = (&UNK_0047c76c)[lVar14];
  uVar6 = (&UNK_0047c76d)[lVar14];
  uVar7 = (&UNK_0047c76e)[lVar14];
  uVar8 = (&UNK_0047c76f)[lVar14];
  ppVar3 = (this->subroutineNameMap).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
           .arrays.elements_;
  uVar4 = (this->subroutineNameMap).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
          .arrays.groups_size_mask;
  uVar15 = 0;
  do {
    pgVar1 = pgVar2 + uVar13;
    auVar18[0] = -(pgVar1->m[0].n == uVar5);
    auVar18[1] = -(pgVar1->m[1].n == uVar6);
    auVar18[2] = -(pgVar1->m[2].n == uVar7);
    auVar18[3] = -(pgVar1->m[3].n == uVar8);
    auVar18[4] = -(pgVar1->m[4].n == uVar5);
    auVar18[5] = -(pgVar1->m[5].n == uVar6);
    auVar18[6] = -(pgVar1->m[6].n == uVar7);
    auVar18[7] = -(pgVar1->m[7].n == uVar8);
    auVar18[8] = -(pgVar1->m[8].n == uVar5);
    auVar18[9] = -(pgVar1->m[9].n == uVar6);
    auVar18[10] = -(pgVar1->m[10].n == uVar7);
    auVar18[0xb] = -(pgVar1->m[0xb].n == uVar8);
    auVar18[0xc] = -(pgVar1->m[0xc].n == uVar5);
    auVar18[0xd] = -(pgVar1->m[0xd].n == uVar6);
    auVar18[0xe] = -(pgVar1->m[0xe].n == uVar7);
    auVar18[0xf] = -(pgVar1->m[0xf].n == uVar8);
    uVar12 = (uint)(ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe);
    if (uVar12 != 0) {
      do {
        iVar9 = 0;
        if (uVar12 != 0) {
          for (; (uVar12 >> iVar9 & 1) == 0; iVar9 = iVar9 + 1) {
          }
        }
        bVar17 = __n == *(size_t *)
                         ((long)&ppVar3[uVar13 * 0xf].first._M_len + (ulong)(uint)(iVar9 << 5));
        pbVar16 = (basic_string_view<char,_std::char_traits<char>_> *)
                  ((long)&ppVar3[uVar13 * 0xf].first._M_len + (ulong)(uint)(iVar9 << 5));
        if (bVar17 && __n != 0) {
          iVar9 = bcmp(__s1,pbVar16->_M_str,__n);
          bVar17 = iVar9 == 0;
        }
        if (bVar17) goto LAB_00143809;
        uVar12 = uVar12 - 1 & uVar12;
      } while (uVar12 != 0);
      pbVar16 = &local_40;
      if (bVar17) goto LAB_00143809;
    }
    if ((pgVar2[uVar13].m[0xf].n &
        (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
          is_not_overflowed(unsigned_long)::shift)[(uint)uVar10 & 7]) == 0) break;
    lVar14 = uVar13 + uVar15;
    uVar15 = uVar15 + 1;
    uVar13 = lVar14 + 1U & uVar4;
  } while (uVar15 <= uVar4);
  pbVar16 = (basic_string_view<char,_std::char_traits<char>_> *)0x0;
LAB_00143809:
  if (pbVar16 == (basic_string_view<char,_std::char_traits<char>_> *)0x0) {
    pSVar11 = (SystemSubroutine *)0x0;
  }
  else {
    pSVar11 = (SystemSubroutine *)pbVar16[1]._M_len;
  }
  return pSVar11;
}

Assistant:

const SystemSubroutine* Compilation::getSystemSubroutine(std::string_view name) const {
    auto it = subroutineNameMap.find(name);
    if (it == subroutineNameMap.end())
        return nullptr;
    return it->second.get();
}